

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O3

void deltest(void *elem)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = 0;
  if (0 < arraylen) {
    do {
      iVar1 = (*cmp)(elem,array[uVar2]);
      if (iVar1 < 1) break;
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < (long)arraylen);
  }
  if ((int)uVar2 < arraylen) {
    iVar1 = (*cmp)(elem,array[uVar2 & 0xffffffff]);
    if (iVar1 == 0) {
      delpostest((int)uVar2);
      return;
    }
  }
  return;
}

Assistant:

void deltest(void *elem)
{
    int i;

    i = 0;
    while (i < arraylen && cmp(elem, array[i]) > 0)
        i++;
    if (i >= arraylen || cmp(elem, array[i]) != 0)
        return;                        /* don't do it! */
    delpostest(i);
}